

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.h
# Opt level: O0

void __thiscall
slang::ast::ForLoopStatement::visitExprs<LookupLhsIdentifier&>
          (ForLoopStatement *this,LookupLhsIdentifier *visitor)

{
  bool bVar1;
  reference ppEVar2;
  LookupLhsIdentifier *in_RDI;
  Expression *step;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3_1;
  Expression *init;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  Expression *in_stack_ffffffffffffffb0;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_40;
  bool *local_38;
  Expression *local_30;
  Expression **local_28;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_20;
  bool *local_18;
  
  local_18 = &(in_RDI->_foundLocation).super__Optional_base<slang::SourceLocation,_true,_true>.
              _M_payload.super__Optional_payload_base<slang::SourceLocation>._M_engaged;
  local_20._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDI);
  local_28 = (Expression **)
             std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                       (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*(&local_20);
    local_30 = *ppEVar2;
    Expression::visit<LookupLhsIdentifier&>(in_stack_ffffffffffffffb0,in_RDI);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_20);
  }
  if (in_RDI[1]._foundLocation.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceLocation>._M_payload !=
      (_Storage<slang::SourceLocation,_true>)0x0) {
    Expression::visit<LookupLhsIdentifier&>(in_stack_ffffffffffffffb0,in_RDI);
  }
  local_38 = &in_RDI[1]._foundLocation.super__Optional_base<slang::SourceLocation,_true,_true>.
              _M_payload.super__Optional_payload_base<slang::SourceLocation>._M_engaged;
  local_40._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDI);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
            (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*(&local_40);
    in_stack_ffffffffffffffb0 = *ppEVar2;
    Expression::visit<LookupLhsIdentifier&>(in_stack_ffffffffffffffb0,in_RDI);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto init : initializers)
            init->visit(visitor);
        if (stopExpr)
            stopExpr->visit(visitor);
        for (auto step : steps)
            step->visit(visitor);
    }